

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_pigpio.c
# Opt level: O0

void t5(void)

{
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  char text [2048];
  int wid;
  int c;
  int oc;
  int e;
  gpioPulse_t wf [4];
  char *TEXT;
  int BAUD;
  char *in_stack_fffffffffffff798;
  char *desc;
  int in_stack_fffffffffffff7a4;
  int in_stack_fffffffffffff7a8;
  int in_stack_fffffffffffff7ac;
  int in_stack_fffffffffffff7b0;
  int in_stack_fffffffffffff7b4;
  undefined1 local_48 [56];
  char *local_10;
  int local_4;
  
  local_4 = 0x12c0;
  local_10 = 
  "\nNow is the winter of our discontent\nMade glorious summer by this sun of York;\nAnd all the clouds that lour\'d upon our house\nIn the deep bosom of the ocean buried.\nNow are our brows bound with victorious wreaths;\nOur bruised arms hung up for monuments;\nOur stern alarums changed to merry meetings,\nOur dreadful marches to delightful measures.\nGrim-visaged war hath smooth\'d his wrinkled front;\nAnd now, instead of mounting barded steeds\nTo fright the souls of fearful adversaries,\nHe capers nimbly in a lady\'s chamber\nTo the lascivious pleasing of a lute.\n"
  ;
  memcpy(local_48,&DAT_00107b00,0x30);
  printf("Waveforms & serial read/write tests.\n");
  t5_count = 0;
  gpioSetAlertFunc(0x19,t5cbf);
  gpioSetMode(0x19,1);
  gpioWaveClear();
  CHECK(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0,in_stack_fffffffffffff7ac,
        in_stack_fffffffffffff7a8,in_stack_fffffffffffff7a4,in_stack_fffffffffffff798);
  gpioWaveAddGeneric(4,local_48);
  CHECK(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0,in_stack_fffffffffffff7ac,
        in_stack_fffffffffffff7a8,in_stack_fffffffffffff7a4,in_stack_fffffffffffff798);
  uVar1 = gpioWaveCreate();
  iVar2 = gpioWaveTxSend(uVar1,1);
  if (iVar2 < 0xe) {
    CHECK(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0,in_stack_fffffffffffff7ac,
          in_stack_fffffffffffff7a8,in_stack_fffffffffffff7a4,in_stack_fffffffffffff798);
  }
  else {
    CHECK(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0,in_stack_fffffffffffff7ac,
          in_stack_fffffffffffff7a8,in_stack_fffffffffffff7a4,in_stack_fffffffffffff798);
  }
  time_sleep(0x4014000000000000);
  CHECK(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0,in_stack_fffffffffffff7ac,
        in_stack_fffffffffffff7a8,in_stack_fffffffffffff7a4,in_stack_fffffffffffff798);
  gpioWaveTxStop();
  CHECK(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0,in_stack_fffffffffffff7ac,
        in_stack_fffffffffffff7a8,in_stack_fffffffffffff7a4,in_stack_fffffffffffff798);
  gpioSerialReadOpen(0x19,local_4,8);
  CHECK(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0,in_stack_fffffffffffff7ac,
        in_stack_fffffffffffff7a8,in_stack_fffffffffffff7a4,in_stack_fffffffffffff798);
  gpioWaveClear();
  iVar2 = local_4;
  sVar4 = strlen(local_10);
  desc = local_10;
  gpioWaveAddSerial(0x19,iVar2,8,2,5000000,sVar4 & 0xffffffff);
  CHECK(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0,in_stack_fffffffffffff7ac,
        in_stack_fffffffffffff7a8,iVar2,desc);
  uVar1 = gpioWaveCreate();
  iVar3 = gpioWaveTxSend(uVar1,0);
  if (iVar3 < 0x1b34) {
    CHECK(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0,in_stack_fffffffffffff7ac,
          in_stack_fffffffffffff7a8,iVar2,desc);
  }
  else {
    CHECK(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0,in_stack_fffffffffffff7ac,
          in_stack_fffffffffffff7a8,iVar2,desc);
  }
  CHECK(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0,in_stack_fffffffffffff7ac,
        in_stack_fffffffffffff7a8,iVar2,desc);
  CHECK(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0,in_stack_fffffffffffff7ac,
        in_stack_fffffffffffff7a8,iVar2,desc);
  while( true ) {
    iVar3 = gpioWaveTxBusy();
    if (iVar3 == 0) break;
    time_sleep(0x3fb999999999999a);
  }
  time_sleep(0x3fb999999999999a);
  iVar3 = gpioSerialRead(0x19,&stack0xfffffffffffff7a8,0x7ff);
  if (0 < iVar3) {
    (&stack0xfffffffffffff7a8)[iVar3] = 0;
  }
  strcmp(local_10,&stack0xfffffffffffff7a8);
  CHECK(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0,in_stack_fffffffffffff7ac,
        in_stack_fffffffffffff7a8,iVar2,desc);
  iVar3 = gpioSerialReadClose(0x19);
  CHECK(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0,in_stack_fffffffffffff7ac,
        in_stack_fffffffffffff7a8,iVar2,desc);
  gpioWaveGetMicros();
  CHECK(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0,in_stack_fffffffffffff7ac,
        in_stack_fffffffffffff7a8,iVar2,desc);
  gpioWaveGetHighMicros();
  CHECK(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0,in_stack_fffffffffffff7ac,
        in_stack_fffffffffffff7a8,iVar2,desc);
  gpioWaveGetMaxMicros();
  CHECK(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0,in_stack_fffffffffffff7ac,
        in_stack_fffffffffffff7a8,iVar2,desc);
  gpioWaveGetPulses();
  CHECK(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0,in_stack_fffffffffffff7ac,
        in_stack_fffffffffffff7a8,iVar2,desc);
  gpioWaveGetHighPulses();
  CHECK(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0,in_stack_fffffffffffff7ac,
        in_stack_fffffffffffff7a8,iVar2,desc);
  gpioWaveGetMaxPulses();
  CHECK(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0,in_stack_fffffffffffff7ac,
        in_stack_fffffffffffff7a8,iVar2,desc);
  gpioWaveGetCbs();
  if (iVar3 < 0x1b33) {
    CHECK(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0,in_stack_fffffffffffff7ac,
          in_stack_fffffffffffff7a8,iVar2,desc);
  }
  else {
    CHECK(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0,in_stack_fffffffffffff7ac,
          in_stack_fffffffffffff7a8,iVar2,desc);
  }
  gpioWaveGetHighCbs();
  if (iVar3 < 0x1b33) {
    CHECK(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0,in_stack_fffffffffffff7ac,
          in_stack_fffffffffffff7a8,iVar2,desc);
  }
  else {
    CHECK(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0,in_stack_fffffffffffff7ac,
          in_stack_fffffffffffff7a8,iVar2,desc);
  }
  gpioWaveGetMaxCbs();
  CHECK(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0,in_stack_fffffffffffff7ac,
        in_stack_fffffffffffff7a8,iVar2,desc);
  return;
}

Assistant:

void t5()
{
   int BAUD=4800;

   char *TEXT=
"\n\
Now is the winter of our discontent\n\
Made glorious summer by this sun of York;\n\
And all the clouds that lour'd upon our house\n\
In the deep bosom of the ocean buried.\n\
Now are our brows bound with victorious wreaths;\n\
Our bruised arms hung up for monuments;\n\
Our stern alarums changed to merry meetings,\n\
Our dreadful marches to delightful measures.\n\
Grim-visaged war hath smooth'd his wrinkled front;\n\
And now, instead of mounting barded steeds\n\
To fright the souls of fearful adversaries,\n\
He capers nimbly in a lady's chamber\n\
To the lascivious pleasing of a lute.\n\
";

   gpioPulse_t wf[] =
   {
      {1<<GPIO, 0,  10000},
      {0, 1<<GPIO,  30000},
      {1<<GPIO, 0,  60000},
      {0, 1<<GPIO, 100000},
   };

   int e, oc, c, wid;

   char text[2048];

   printf("Waveforms & serial read/write tests.\n");

   t5_count = 0;

   gpioSetAlertFunc(GPIO, t5cbf);

   gpioSetMode(GPIO, PI_OUTPUT);

   e = gpioWaveClear();
   CHECK(5, 1, e, 0, 0, "callback, set mode, wave clear");

   e = gpioWaveAddGeneric(4, wf);
   CHECK(5, 2, e, 4, 0, "pulse, wave add generic");

   wid = gpioWaveCreate();
   e = gpioWaveTxSend(wid, PI_WAVE_MODE_REPEAT);
   if (e < 14) CHECK(5, 3, e,  9, 0, "wave tx repeat");
   else        CHECK(5, 3, e, 19, 0, "wave tx repeat");

   oc = t5_count;
   time_sleep(5);
   c = t5_count - oc;
   CHECK(5, 4, c, 50, 1, "callback");

   e = gpioWaveTxStop();
   CHECK(5, 5, e, 0, 0, "wave tx stop");

   /* gpioSerialReadOpen changes the alert function */

   e = gpioSerialReadOpen(GPIO, BAUD, 8);
   CHECK(5, 6, e, 0, 0, "serial read open");

   gpioWaveClear();
   e = gpioWaveAddSerial(GPIO, BAUD, 8, 2, 5000000, strlen(TEXT), TEXT);
   CHECK(5, 7, e, 3405, 0, "wave clear, wave add serial");

   wid = gpioWaveCreate();
   e = gpioWaveTxSend(wid, PI_WAVE_MODE_ONE_SHOT);
   if (e < 6964) CHECK(5, 8, e, 6811, 0, "wave tx start");
   else          CHECK(5, 8, e, 7116, 0, "wave tx start");

   CHECK(5, 9, 0, 0, 0, "NOT APPLICABLE");

   CHECK(5, 10, 0, 0, 0, "NOT APPLICABLE");

   while (gpioWaveTxBusy()) time_sleep(0.1);
   time_sleep(0.1);
   c = gpioSerialRead(GPIO, text, sizeof(text)-1);
   if (c > 0) text[c] = 0;
   CHECK(5, 11, strcmp(TEXT, text), 0, 0, "wave tx busy, serial read");

   e = gpioSerialReadClose(GPIO);
   CHECK(5, 12, e, 0, 0, "serial read close");

   c = gpioWaveGetMicros();
   CHECK(5, 13, c, 6158148, 0, "wave get micros");

   c = gpioWaveGetHighMicros();
   CHECK(5, 14, c, 6158148, 0, "wave get high micros");

   c = gpioWaveGetMaxMicros();
   CHECK(5, 15, c, 1800000000, 0, "wave get max micros");

   c = gpioWaveGetPulses();
   CHECK(5, 16, c, 3405, 0, "wave get pulses");

   c = gpioWaveGetHighPulses();
   CHECK(5, 17, c, 3405, 0, "wave get high pulses");

   c = gpioWaveGetMaxPulses();
   CHECK(5, 18, c, 12000, 0, "wave get max pulses");

   c = gpioWaveGetCbs();
   if (e < 6963) CHECK(5, 19, c, 6810, 0, "wave get cbs");
   else          CHECK(5, 19, c, 7115, 0, "wave get cbs");

   c = gpioWaveGetHighCbs();
   if (e < 6963) CHECK(5, 20, c, 6810, 0, "wave get high cbs");
   else          CHECK(5, 20, c, 7115, 0, "wave get high cbs");

   c = gpioWaveGetMaxCbs();
   CHECK(5, 21, c, 25016, 0, "wave get max cbs");
}